

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O2

void test_2d_static<0ul,0ul,1ul,1ul>(void)

{
  bool bVar1;
  size_t *psVar2;
  size_t *psVar3;
  size_t *psStackY_60;
  int dptr [1];
  size_t true_idx;
  size_t *local_40;
  int *local_38;
  
  true_idx = CONCAT71(true_idx._1_7_,1);
  local_40 = (size_t *)CONCAT71(local_40._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1d,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",(bool *)&true_idx,
             (bool *)&local_40);
  true_idx = 1;
  local_40._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1f,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&true_idx,
             (int *)&local_40);
  true_idx = 1;
  local_40 = (size_t *)CONCAT44(local_40._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x20,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&true_idx,
             (int *)&local_40);
  true_idx = 1;
  local_40 = (size_t *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x22,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&true_idx,
             (unsigned_long *)&local_40);
  true_idx = 1;
  local_40 = (size_t *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x23,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&true_idx,
             (unsigned_long *)&local_40);
  bVar1 = true;
  psVar3 = (size_t *)dptr;
  psVar2 = (size_t *)0x0;
  while (bVar1) {
    bVar1 = true;
    psStackY_60 = (size_t *)0x0;
    while (bVar1) {
      true_idx = (size_t)psStackY_60;
      local_40 = psVar2;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2d,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",
                 (unsigned_long *)&local_40,&true_idx);
      local_38 = dptr + true_idx;
      local_40 = psVar3;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2f,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",
                 (int **)&local_40,&local_38);
      dptr[0] = 0x2a;
      local_40 = (size_t *)CONCAT44(local_40._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x33,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",(int *)psVar3,
                 (int *)&local_40);
      bVar1 = false;
      psStackY_60 = (size_t *)0x1;
    }
    bVar1 = false;
    psVar3 = &true_idx;
    psStackY_60 = (size_t *)0x1;
    psVar2 = psStackY_60;
  }
  psVar3 = (size_t *)dptr;
  bVar1 = true;
  psVar2 = (size_t *)0x0;
  while (bVar1) {
    bVar1 = true;
    psStackY_60 = (size_t *)0x0;
    while (bVar1) {
      true_idx = (size_t)psStackY_60;
      local_40 = psVar2;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3c,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",
                 (unsigned_long *)&local_40,&true_idx);
      local_38 = dptr + true_idx;
      local_40 = psVar3;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3e,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",
                 (int **)&local_40,&local_38);
      bVar1 = false;
      psStackY_60 = (size_t *)0x1;
    }
    bVar1 = false;
    psVar3 = &true_idx;
    psStackY_60 = (size_t *)0x1;
    psVar2 = psStackY_60;
  }
  psVar3 = (size_t *)dptr;
  bVar1 = true;
  psVar2 = (size_t *)0x0;
  while (bVar1) {
    bVar1 = true;
    psStackY_60 = (size_t *)0x0;
    while (bVar1) {
      true_idx = (size_t)psStackY_60;
      local_40 = psVar2;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x57,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",
                 (unsigned_long *)&local_40,&true_idx);
      local_38 = dptr + true_idx;
      local_40 = psVar3;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x59,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",
                 (int **)&local_40,&local_38);
      local_40 = (size_t *)CONCAT44(local_40._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x6a,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",(int *)psVar3,
                 (int *)&local_40);
      bVar1 = false;
      psStackY_60 = (size_t *)0x1;
    }
    bVar1 = false;
    psVar3 = &true_idx;
    psStackY_60 = (size_t *)0x1;
    psVar2 = psStackY_60;
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<N, M>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    int dptr[(X + N) * (Y + M)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}